

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O0

apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *self)

{
  apx_error_t local_14;
  apx_error_t retval;
  apx_vm_serializer_t *self_local;
  
  if (self == (apx_vm_serializer_t *)0x0) {
    __assert_fail("self != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                  ,0x6ba,"apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)")
    ;
  }
  local_14 = 0;
  if ((self->buffer).end < (self->buffer).next + self->state->element_size) {
    local_14 = 0x25;
  }
  else {
    switch(self->state->type_code) {
    case '\x01':
      if (self->state->scalar_storage_type != '\x02') {
        __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT32",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6c1,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      if (self->state->element_size != 1) {
        __assert_fail("self->state->element_size == UINT8_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6c2,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      packLE((self->buffer).next,(self->state->scalar_value).u32,(uint8_t)self->state->element_size)
      ;
      break;
    case '\x02':
      if (self->state->scalar_storage_type != '\x02') {
        __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT32",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6c6,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      if (self->state->element_size != 2) {
        __assert_fail("self->state->element_size == UINT16_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6c7,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      packLE((self->buffer).next,(self->state->scalar_value).u32,(uint8_t)self->state->element_size)
      ;
      break;
    case '\x03':
      if (self->state->scalar_storage_type != '\x02') {
        __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT32",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6cb,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      if (self->state->element_size != 4) {
        __assert_fail("self->state->element_size == UINT32_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6cc,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      packLE((self->buffer).next,(self->state->scalar_value).u32,(uint8_t)self->state->element_size)
      ;
      break;
    case '\x04':
      if (self->state->scalar_storage_type != '\x04') {
        __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT64",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6d0,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      if (self->state->element_size != 8) {
        __assert_fail("self->state->element_size == UINT64_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6d1,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      packLE64((self->buffer).next,(self->state->scalar_value).u64,
               (uint8_t)self->state->element_size);
      break;
    case '\x05':
      if (self->state->scalar_storage_type != '\x01') {
        __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6d5,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      if (self->state->element_size != 1) {
        __assert_fail("self->state->element_size == INT8_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6d6,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      packLE((self->buffer).next,(self->state->scalar_value).u32,(uint8_t)self->state->element_size)
      ;
      break;
    case '\x06':
      if (self->state->scalar_storage_type != '\x01') {
        __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6da,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      if (self->state->element_size != 2) {
        __assert_fail("self->state->element_size == INT16_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6db,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      packLE((self->buffer).next,(self->state->scalar_value).u32,(uint8_t)self->state->element_size)
      ;
      break;
    case '\a':
      if (self->state->scalar_storage_type != '\x01') {
        __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6df,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      if (self->state->element_size != 4) {
        __assert_fail("self->state->element_size == INT32_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6e0,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      packLE((self->buffer).next,(self->state->scalar_value).u32,(uint8_t)self->state->element_size)
      ;
      break;
    case '\b':
      if (self->state->scalar_storage_type != '\x03') {
        __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT64",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6e4,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      if (self->state->element_size != 8) {
        __assert_fail("self->state->element_size == INT64_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6e5,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      packLE64((self->buffer).next,(self->state->scalar_value).u64,
               (uint8_t)self->state->element_size);
      break;
    default:
      local_14 = 10;
      break;
    case '\r':
      if (self->state->scalar_storage_type != '\x05') {
        __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_BOOL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6e9,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      if (self->state->element_size != 1) {
        __assert_fail("self->state->element_size == BOOL_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                      ,0x6ea,
                      "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
      }
      packLE64((self->buffer).next,(ulong)(((self->state->scalar_value).bl & 1U) != 0),
               (uint8_t)self->state->element_size);
    }
    (self->buffer).next = (self->buffer).next + self->state->element_size;
  }
  return local_14;
}

Assistant:

static apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t* self)
{
   assert(self != NULL);
   apx_error_t retval = APX_NO_ERROR;
   if ((self->buffer.next + self->state->element_size) <= self->buffer.end)
   {
      switch (self->state->type_code)
      {
      case APX_TYPE_CODE_UINT8:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT32);
         assert(self->state->element_size == UINT8_SIZE);
         packLE(self->buffer.next, self->state->scalar_value.u32, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_UINT16:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT32);
         assert(self->state->element_size == UINT16_SIZE);
         packLE(self->buffer.next, self->state->scalar_value.u32, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_UINT32:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT32);
         assert(self->state->element_size == UINT32_SIZE);
         packLE(self->buffer.next, self->state->scalar_value.u32, (uint8_t) self->state->element_size);
         break;
      case APX_TYPE_CODE_UINT64:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT64);
         assert(self->state->element_size == UINT64_SIZE);
         packLE64(self->buffer.next, self->state->scalar_value.u64, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_INT8:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32);
         assert(self->state->element_size == INT8_SIZE);
         packLE(self->buffer.next, (uint32_t) self->state->scalar_value.i32, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_INT16:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32);
         assert(self->state->element_size == INT16_SIZE);
         packLE(self->buffer.next, (uint32_t)self->state->scalar_value.i32, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_INT32:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32);
         assert(self->state->element_size == INT32_SIZE);
         packLE(self->buffer.next, (uint32_t)self->state->scalar_value.i32, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_INT64:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT64);
         assert(self->state->element_size == INT64_SIZE);
         packLE64(self->buffer.next, (uint64_t)self->state->scalar_value.i64, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_BOOL:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_BOOL);
         assert(self->state->element_size == BOOL_SIZE);
         packLE64(self->buffer.next, self->state->scalar_value.bl? 1u : 0u, (uint8_t)self->state->element_size);
         break;
      default:
         retval = APX_UNSUPPORTED_ERROR;
      }
      self->buffer.next += self->state->element_size;
   }
   else
   {
      retval = APX_BUFFER_BOUNDARY_ERROR;
   }
   return retval;

}